

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O0

int kvtree_exchange(kvtree *send,kvtree *recv,MPI_Comm comm)

{
  uint uVar1;
  int iVar2;
  kvtree *hash2;
  int local_8c;
  int right_rc;
  int rc;
  int all_steps [2];
  kvtree *tmp;
  int steps_right;
  int steps_left;
  int step;
  int dist;
  int hops_right;
  int hops_left;
  int dist_right;
  int dist_left;
  kvtree *elem_hash;
  kvtree_elem *pkStack_48;
  int dest;
  kvtree_elem *elem;
  int max_steps [2];
  kvtree *right;
  kvtree *left;
  int ranks;
  int rank;
  MPI_Comm comm_local;
  kvtree *recv_local;
  kvtree *send_local;
  
  _ranks = comm;
  comm_local = (MPI_Comm)recv;
  recv_local = send;
  MPI_Comm_rank(comm,(long)&left + 4);
  MPI_Comm_size(_ranks,&left);
  right = kvtree_new();
  max_steps = (int  [2])kvtree_new();
  elem._0_4_ = 0;
  elem._4_4_ = 0;
  for (pkStack_48 = kvtree_elem_first(recv_local); pkStack_48 != (kvtree_elem *)0x0;
      pkStack_48 = kvtree_elem_next(pkStack_48)) {
    uVar1 = kvtree_elem_key_int(pkStack_48);
    hash2 = kvtree_elem_hash(pkStack_48);
    hops_left = left._4_4_ - uVar1;
    if (hops_left < 0) {
      hops_left = (int)left + hops_left;
    }
    hops_right = uVar1 - left._4_4_;
    if (hops_right < 0) {
      hops_right = (int)left + hops_right;
    }
    dist = 0;
    step = 0;
    steps_right = 1;
    tmp._4_4_ = 0;
    tmp._0_4_ = 0;
    for (steps_left = 1; steps_left < (int)left; steps_left = steps_left << 1) {
      if ((hops_left & steps_left) != 0) {
        dist = dist + 1;
        tmp._4_4_ = steps_right;
      }
      if ((hops_right & steps_left) != 0) {
        step = step + 1;
        tmp._0_4_ = steps_right;
      }
      steps_right = steps_right + 1;
    }
    all_steps = (int  [2])kvtree_new();
    kvtree_merge((kvtree *)all_steps,hash2);
    if (dist < step) {
      kvtree_setf(right,(kvtree *)all_steps,"%d",(ulong)uVar1);
      if ((int)elem < tmp._4_4_) {
        elem._0_4_ = tmp._4_4_;
      }
    }
    else {
      kvtree_setf((kvtree *)max_steps,(kvtree *)all_steps,"%d",(ulong)uVar1);
      if (elem._4_4_ < (int)tmp) {
        elem._4_4_ = (int)tmp;
      }
    }
  }
  MPI_Allreduce(&elem,&right_rc,2,&ompi_mpi_int,&ompi_mpi_op_max,_ranks);
  local_8c = kvtree_exchange_direction_hops
                       (right,(kvtree *)comm_local,_ranks,KVTREE_EXCHANGE_LEFT,right_rc);
  iVar2 = kvtree_exchange_direction_hops
                    ((kvtree *)max_steps,(kvtree *)comm_local,_ranks,KVTREE_EXCHANGE_RIGHT,rc);
  if (local_8c == 0) {
    local_8c = iVar2;
  }
  kvtree_delete((kvtree **)max_steps);
  kvtree_delete(&right);
  return local_8c;
}

Assistant:

int kvtree_exchange(const kvtree* send, kvtree* recv, MPI_Comm comm)
{
  /* get our rank and number of ranks in comm */
  int rank, ranks;
  MPI_Comm_rank(comm, &rank);
  MPI_Comm_size(comm, &ranks);

  /* Since we have two paths, we try to be more efficient by sending
   * each item in the direction of fewest hops.  For example, consider
   * an 11 task job in which rank 0 wants to send to rank 8.
   * Rank 8 is closer to rank 0 from the left (dist = 3) than the
   * right (dist = 8).  However rank 0 can send to rank 8 using
   * a single hop (direct send) going right whereas the data takes 2
   * hops to go left. In this case, we send the data to the right to
   * minimize the number of hops. */
  kvtree* left  = kvtree_new();
  kvtree* right = kvtree_new();

  /* we compute maximum steps needed to each side */
  int max_steps[2];
  max_steps[STEPS_LEFT]  = 0;
  max_steps[STEPS_RIGHT] = 0;

  /* iterate through elements and assign to left or right hash */
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(send);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get dest rank and pointer to hash for that rank */
    int dest = kvtree_elem_key_int(elem);
    kvtree* elem_hash = kvtree_elem_hash(elem);

    /* compute distance to our left */
    int dist_left = rank - dest;
    if (dist_left < 0) {
      dist_left += ranks;
    }

    /* compute distance to our right */
    int dist_right = dest - rank;
    if (dist_right < 0) {
      dist_right += ranks;
    }

    /* count hops in each direction */
    int hops_left = 0;
    int hops_right = 0;
    int dist = 1;
    int step = 1;
    int steps_left  = 0;
    int steps_right = 0;
    while (dist < ranks) {
      /* if distance is odd in this bit,
       * we'd send it during this step */
      if (dist_left & dist) {
        hops_left++;
        steps_left = step;
      }
      if (dist_right & dist) {
        hops_right++;
        steps_right = step;
      }

      /* go to the next step */
      dist <<= 1;
      step++;
    }

    /* assign to hash having the fewest hops */
    kvtree* tmp = kvtree_new();
    kvtree_merge(tmp, elem_hash);
    if (hops_left < hops_right) {
      /* assign to left-going exchange */
      kvtree_setf(left, tmp, "%d", dest);
      if (steps_left > max_steps[STEPS_LEFT]) {
        max_steps[STEPS_LEFT] = steps_left;
      }
    } else {
      /* assign to right-going exchange */
      kvtree_setf(right, tmp, "%d", dest);
      if (steps_right > max_steps[STEPS_RIGHT]) {
        max_steps[STEPS_RIGHT] = steps_right;
      }
    }
  }

  /* most hash exchanges have a small number of hops
   * compared to the size of the job, so determine max
   * hops counts with allreduce and cut exchange off early */
  int all_steps[2];
  MPI_Allreduce(max_steps, all_steps, 2, MPI_INT, MPI_MAX, comm);

  /* delegate work to kvtree_exchange_direction */
  int rc = kvtree_exchange_direction_hops(
    left, recv, comm, KVTREE_EXCHANGE_LEFT, all_steps[STEPS_LEFT]
  );
  int right_rc = kvtree_exchange_direction_hops(
    right, recv, comm, KVTREE_EXCHANGE_RIGHT, all_steps[STEPS_RIGHT]
  );
  if (rc == KVTREE_SUCCESS) {
    rc = right_rc;
  }

  /* free our left and right hashes */
  kvtree_delete(&right);
  kvtree_delete(&left);

  return rc;
}